

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int wally_tx_input_init(uchar *txhash,size_t txhash_len,uint32_t utxo_index,uint32_t sequence,
                       uchar *script,size_t script_len,wally_tx_witness_stack *witness,
                       wally_tx_input *output)

{
  int iVar1;
  
  iVar1 = tx_elements_input_init
                    (txhash,txhash_len,utxo_index,sequence,script,script_len,witness,(uchar *)0x0,0,
                     (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                     (wally_tx_witness_stack *)0x0,output,false);
  return iVar1;
}

Assistant:

int wally_tx_input_init(const unsigned char *txhash, size_t txhash_len,
                        uint32_t utxo_index, uint32_t sequence,
                        const unsigned char *script, size_t script_len,
                        const struct wally_tx_witness_stack *witness,
                        struct wally_tx_input *output)
{
    return tx_elements_input_init(txhash, txhash_len,
                                  utxo_index, sequence,
                                  script, script_len,
                                  witness, NULL, 0, NULL, 0,
                                  NULL, 0, NULL, 0, NULL, 0, NULL, 0, NULL,
                                  output, false);
}